

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::~UEFITool(UEFITool *this)

{
  FfsBuilder *this_00;
  FfsOperations *this_01;
  FfsFinder *this_02;
  FfsParser *this_03;
  FfsReport *this_04;
  UEFITool *this_local;
  
  *(undefined ***)this = &PTR_metaObject_0037a028;
  *(undefined ***)&this->field_0x10 = &PTR__UEFITool_0037a1e0;
  this_00 = this->ffsBuilder;
  if (this_00 != (FfsBuilder *)0x0) {
    FfsBuilder::~FfsBuilder(this_00);
    operator_delete(this_00,0x20);
  }
  this_01 = this->ffsOps;
  if (this_01 != (FfsOperations *)0x0) {
    FfsOperations::~FfsOperations(this_01);
    operator_delete(this_01,0x20);
  }
  this_02 = this->ffsFinder;
  if (this_02 != (FfsFinder *)0x0) {
    FfsFinder::~FfsFinder(this_02);
    operator_delete(this_02,0x20);
  }
  this_03 = this->ffsParser;
  if (this_03 != (FfsParser *)0x0) {
    FfsParser::~FfsParser(this_03);
    operator_delete(this_03,200);
  }
  this_04 = this->ffsReport;
  if (this_04 != (FfsReport *)0x0) {
    FfsReport::~FfsReport(this_04);
    operator_delete(this_04,8);
  }
  if (this->model != (TreeModel *)0x0) {
    (**(code **)(*(long *)this->model + 0x20))();
  }
  if (this->hexViewDialog != (HexViewDialog *)0x0) {
    (**(code **)(*(long *)this->hexViewDialog + 0x20))();
  }
  if (this->searchDialog != (SearchDialog *)0x0) {
    (**(code **)(*(long *)this->searchDialog + 0x20))();
  }
  if (this->ui != (UEFITool *)0x0) {
    operator_delete(this->ui,600);
  }
  QString::~QString(&this->version);
  QFont::~QFont(&this->currentFont);
  QString::~QString(&this->currentProgramPath);
  QString::~QString(&this->currentPath);
  QString::~QString(&this->currentDir);
  QMainWindow::~QMainWindow(&this->super_QMainWindow);
  return;
}

Assistant:

UEFITool::~UEFITool()
{
    delete ffsBuilder;
    delete ffsOps;
    delete ffsFinder;
    delete ffsParser;
    delete ffsReport;
    delete model;
    delete hexViewDialog;
    delete searchDialog;
    delete ui;
}